

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_timer_node.cpp
# Opt level: O0

void __thiscall
decorator_timer_node_timer_true_Test::TestBody(decorator_timer_node_timer_true_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer paVar3;
  anon_class_1_0_00000001 local_289;
  function<void_(bool,_test_agent_*)> local_288;
  anon_class_1_0_00000001 local_261;
  function<void_(bool,_test_agent_*)> local_260;
  int local_23c;
  duration<long,_std::ratio<1L,_1000L>_> local_238;
  anon_class_1_0_00000001 local_229;
  function<void_(bool,_test_agent_*)> local_228;
  int local_204;
  duration<long,_std::ratio<1L,_1L>_> local_200;
  anon_class_1_0_00000001 local_1f1;
  function<void_(bool,_test_agent_*)> local_1f0;
  undefined1 local_1d0 [8];
  test_agent_proxy ap;
  Message local_150;
  size_t local_148;
  undefined4 local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  size_t local_118;
  undefined4 local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  test_agent agent;
  AssertHelper local_e0;
  Message local_d8;
  void *local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_a8 [8];
  node_pointer root;
  test_generator gen;
  decorator_timer_node_timer_true_Test *this_local;
  
  test_generator::test_generator((test_generator *)&root);
  ranger::bhvr_tree::
  xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
  ::generate((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
              *)local_a8,(char *)&root);
  local_d0 = (void *)0x0;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>>
            ((internal *)local_c8,"nullptr","root",&local_d0,
             (unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
              *)local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/decorator_timer_node.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (bVar1) {
    test_agent::test_agent((test_agent *)&gtest_ar_1.message_);
    local_10c = 0;
    local_118 = test_agent::get_true_counter((test_agent *)&gtest_ar_1.message_);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (local_108,"0",(int *)"agent.get_true_counter()",(unsigned_long *)&local_10c,
               &local_118);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/decorator_timer_node.cpp"
                 ,0x2c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    local_13c = 0;
    local_148 = test_agent::get_false_counter((test_agent *)&gtest_ar_1.message_);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (local_138,"0",(int *)"agent.get_false_counter()",(unsigned_long *)&local_13c,
               &local_148);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ap.m_agent,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/decorator_timer_node.cpp"
                 ,0x2d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ap.m_agent,&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ap.m_agent);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    ranger::bhvr_tree::
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::agent_proxy((agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                   *)local_1d0,(agent_type *)&gtest_ar_1.message_);
    paVar3 = std::
             unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
             ::operator->((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                           *)local_a8);
    std::function<void(bool,test_agent*)>::
    function<decorator_timer_node_timer_true_Test::TestBody()::__0,void>
              ((function<void(bool,test_agent*)> *)&local_1f0,&local_1f1);
    (*paVar3->_vptr_abstract_node[2])(paVar3,local_1d0,&local_1f0);
    std::function<void_(bool,_test_agent_*)>::~function(&local_1f0);
    local_204 = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_200,&local_204);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_200);
    paVar3 = std::
             unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
             ::operator->((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                           *)local_a8);
    std::function<void(bool,test_agent*)>::
    function<decorator_timer_node_timer_true_Test::TestBody()::__1,void>
              ((function<void(bool,test_agent*)> *)&local_228,&local_229);
    (*paVar3->_vptr_abstract_node[2])(paVar3,local_1d0,&local_228);
    std::function<void_(bool,_test_agent_*)>::~function(&local_228);
    local_23c = 500;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_238,&local_23c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_238);
    paVar3 = std::
             unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
             ::operator->((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                           *)local_a8);
    std::function<void(bool,test_agent*)>::
    function<decorator_timer_node_timer_true_Test::TestBody()::__2,void>
              ((function<void(bool,test_agent*)> *)&local_260,&local_261);
    (*paVar3->_vptr_abstract_node[2])(paVar3,local_1d0,&local_260);
    std::function<void_(bool,_test_agent_*)>::~function(&local_260);
    paVar3 = std::
             unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
             ::operator->((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                           *)local_a8);
    std::function<void(bool,test_agent*)>::
    function<decorator_timer_node_timer_true_Test::TestBody()::__3,void>
              ((function<void(bool,test_agent*)> *)&local_288,&local_289);
    (*paVar3->_vptr_abstract_node[2])(paVar3,local_1d0,&local_288);
    std::function<void_(bool,_test_agent_*)>::~function(&local_288);
    ranger::bhvr_tree::
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::~agent_proxy((agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                    *)local_1d0);
  }
  std::
  unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
  ::~unique_ptr((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                 *)local_a8);
  test_generator::~test_generator((test_generator *)&root);
  return;
}

Assistant:

TEST(decorator_timer_node, timer_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"decorator_timer_node\" duration = \"1.5\">"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(0, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });

  std::this_thread::sleep_for(std::chrono::seconds(1));

  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(0, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });

  std::this_thread::sleep_for(std::chrono::milliseconds(500));

  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });

  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}